

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell::
~TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell
          (TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell *this)

{
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell *this_local;
  
  ~TEST_TestHarness_c_cpputest_malloc_out_of_memory_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestHarness_c, cpputest_malloc_out_of_memory)
{
    cpputest_malloc_set_out_of_memory();
    CHECK(NULLPTR == cpputest_malloc(100));

    cpputest_malloc_set_not_out_of_memory();
    void * mem = cpputest_malloc(100);
    CHECK(NULLPTR != mem);
    cpputest_free(mem);
}